

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

OPJ_BOOL opj_pi_next(opj_pi_iterator_t *pi)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  OPJ_UINT32 OVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  OPJ_UINT32 OVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  char *fmt;
  OPJ_INT16 *pOVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  opj_pi_comp_t *poVar19;
  opj_pi_comp_t *poVar20;
  opj_event_mgr_t *p_event_mgr;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  opj_pi_resolution_t *poVar24;
  long lVar25;
  OPJ_UINT32 OVar26;
  bool bVar27;
  uint local_60;
  uint local_58;
  
  switch((pi->poc).prg) {
  case OPJ_LRCP:
    uVar23 = (pi->poc).compno0;
    if ((uVar23 < pi->numcomps) && (uVar7 = (pi->poc).compno1, uVar7 < pi->numcomps + 1)) {
      if (pi->first == 0) {
        uVar13 = pi->precno;
        goto LAB_0012c2a5;
      }
      pi->first = 0;
      uVar13 = (pi->poc).layno0;
      do {
        pi->layno = uVar13;
        if ((pi->poc).layno1 <= uVar13) {
          return 0;
        }
        uVar13 = (pi->poc).resno0;
        while (pi->resno = uVar13, uVar13 < (pi->poc).resno1) {
          pi->compno = uVar23;
          uVar13 = uVar23;
          while (uVar13 < uVar7) {
            uVar21 = pi->resno;
            if (uVar21 < pi->comps[uVar13].numresolutions) {
              if (pi->tp_on == '\0') {
                poVar24 = pi->comps[uVar13].resolutions;
                (pi->poc).precno1 = poVar24[uVar21].ph * poVar24[uVar21].pw;
              }
              for (uVar13 = (pi->poc).precno0; pi->precno = uVar13, uVar13 < (pi->poc).precno1;
                  uVar13 = uVar13 + 1) {
                uVar21 = pi->step_p * uVar13 +
                         pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
                if (pi->include_size <= uVar21) goto LAB_0012c36c;
                pOVar14 = pi->include;
                uVar22 = (ulong)uVar21;
                if (pOVar14[uVar22] == 0) {
LAB_0012c37f:
                  pOVar14[uVar22] = 1;
                  return 1;
                }
LAB_0012c2a5:
              }
              uVar13 = pi->compno;
            }
            uVar13 = uVar13 + 1;
            pi->compno = uVar13;
          }
          uVar13 = pi->resno + 1;
        }
        uVar13 = pi->layno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_lrcp(): invalid compno0/compno1\n";
    break;
  case OPJ_RLCP:
    uVar23 = (pi->poc).compno0;
    if ((uVar23 < pi->numcomps) && (uVar7 = (pi->poc).compno1, uVar7 < pi->numcomps + 1)) {
      if (pi->first == 0) {
        uVar13 = pi->precno;
        goto LAB_0012c442;
      }
      pi->first = 0;
      uVar13 = (pi->poc).resno0;
      do {
        pi->resno = uVar13;
        if ((pi->poc).resno1 <= uVar13) {
          return 0;
        }
        uVar13 = (pi->poc).layno0;
        while (pi->layno = uVar13, uVar13 < (pi->poc).layno1) {
          pi->compno = uVar23;
          uVar13 = uVar23;
          while (uVar13 < uVar7) {
            uVar21 = pi->resno;
            if (uVar21 < pi->comps[uVar13].numresolutions) {
              if (pi->tp_on == '\0') {
                poVar24 = pi->comps[uVar13].resolutions;
                (pi->poc).precno1 = poVar24[uVar21].ph * poVar24[uVar21].pw;
              }
              for (uVar13 = (pi->poc).precno0; pi->precno = uVar13, uVar13 < (pi->poc).precno1;
                  uVar13 = uVar13 + 1) {
                uVar21 = pi->step_p * uVar13 +
                         pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
                if (pi->include_size <= uVar21) goto LAB_0012c36c;
                pOVar14 = pi->include;
                uVar22 = (ulong)uVar21;
                if (pOVar14[uVar22] == 0) goto LAB_0012c37f;
LAB_0012c442:
              }
              uVar13 = pi->compno;
            }
            uVar13 = uVar13 + 1;
            pi->compno = uVar13;
          }
          uVar13 = pi->layno + 1;
        }
        uVar13 = pi->resno + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_rlcp(): invalid compno0/compno1\n";
    break;
  case OPJ_RPCL:
    uVar23 = (pi->poc).compno0;
    uVar7 = pi->numcomps;
    if ((uVar23 < uVar7) && (uVar13 = (pi->poc).compno1, uVar13 < uVar7 + 1)) {
      if (pi->first == 0) {
        uVar7 = pi->layno;
        goto LAB_0012c453;
      }
      pi->first = 0;
      pi->dx = 0;
      pi->dy = 0;
      uVar21 = 0;
      OVar26 = 0;
      uVar22 = 0;
      do {
        uVar12 = pi->comps[uVar22].numresolutions;
        uVar8 = (ulong)uVar12;
        if (uVar8 != 0) {
          poVar20 = pi->comps + uVar22;
          poVar24 = poVar20->resolutions;
          lVar25 = 0;
          do {
            uVar12 = uVar12 - 1;
            uVar15 = *(int *)((long)&poVar24->pdx + lVar25) + uVar12;
            if (uVar15 < 0x20) {
              bVar9 = (byte)uVar15;
              if (poVar20->dx <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar15 = poVar20->dx << (bVar9 & 0x1f);
                OVar3 = uVar15;
                if (OVar26 < uVar15) {
                  OVar3 = OVar26;
                }
                bVar27 = OVar26 == 0;
                OVar26 = OVar3;
                if (bVar27) {
                  OVar26 = uVar15;
                }
                pi->dx = OVar26;
              }
            }
            uVar15 = *(int *)((long)&poVar24->pdy + lVar25) + uVar12;
            if (uVar15 < 0x20) {
              bVar9 = (byte)uVar15;
              if (poVar20->dy <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar18 = poVar20->dy << (bVar9 & 0x1f);
                uVar15 = uVar18;
                if (uVar21 < uVar18) {
                  uVar15 = uVar21;
                }
                bVar27 = uVar21 == 0;
                uVar21 = uVar15;
                if (bVar27) {
                  uVar21 = uVar18;
                }
                pi->dy = uVar21;
              }
            }
            lVar25 = lVar25 + 0x10;
          } while (uVar8 << 4 != lVar25);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar7);
      if (OVar26 == 0) {
        return 0;
      }
      if (uVar21 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar26 = pi->ty0;
        OVar3 = pi->tx1;
        OVar6 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar3;
        (pi->poc).ty0 = OVar26;
        (pi->poc).ty1 = OVar6;
      }
      uVar7 = (pi->poc).resno0;
      pi->resno = uVar7;
      do {
        if ((pi->poc).resno1 <= uVar7) {
          return 0;
        }
        uVar7 = (pi->poc).ty0;
        while (pi->y = uVar7, uVar7 < (pi->poc).ty1) {
          uVar7 = (pi->poc).tx0;
          while (pi->x = uVar7, uVar7 < (pi->poc).tx1) {
            pi->compno = uVar23;
            OVar26 = uVar23;
            while (OVar26 < uVar13) {
              uVar7 = pi->resno;
              uVar21 = pi->comps[OVar26].numresolutions;
              if ((uVar7 < uVar21) && (uVar21 = uVar21 + ~uVar7, uVar21 < 0x20)) {
                poVar20 = pi->comps + OVar26;
                uVar12 = poVar20->dx;
                bVar9 = (byte)uVar21;
                uVar15 = uVar12 << (bVar9 & 0x1f);
                if (uVar15 >> (bVar9 & 0x1f) == uVar12) {
                  uVar18 = poVar20->dy;
                  uVar17 = uVar18 << (bVar9 & 0x1f);
                  if ((uVar17 >> (bVar9 & 0x1f) == uVar18) && (-1 < (int)(uVar17 | uVar15))) {
                    if (uVar12 << (bVar9 & 0x1f) == 0) {
LAB_0012cea2:
                      __assert_fail("b",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                    ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
                    }
                    uVar22 = CONCAT44(0,uVar15);
                    auVar1._8_4_ = 0;
                    auVar1._0_8_ = uVar22;
                    auVar4._8_4_ = 0 >> (bVar9 & 0x1f);
                    auVar4._0_8_ = uVar22 + pi->tx0 + -1;
                    if (uVar18 << (bVar9 & 0x1f) == 0) goto LAB_0012cea2;
                    poVar24 = poVar20->resolutions + uVar7;
                    uVar8 = (ulong)uVar17;
                    uVar7 = poVar24->pdx + uVar21;
                    if ((uVar7 < 0x1f) &&
                       (bVar10 = (byte)uVar7, uVar12 <= 0xffffffffU >> (bVar10 & 0x1f))) {
                      uVar21 = poVar24->pdy + uVar21;
                      if (uVar21 < 0x1f) {
                        bVar11 = (byte)uVar21;
                        uVar7 = uVar18 << (bVar11 & 0x1f);
                        if (uVar7 >> (bVar11 & 0x1f) == uVar18) {
                          uVar21 = pi->y;
                          uVar15 = (uint)(((pi->ty0 + uVar8) - 1) / uVar8);
                          if ((uVar21 % uVar7 == 0) ||
                             ((uVar21 == pi->ty0 &&
                              ((uVar15 << (bVar9 & 0x1f) & ~(-1 << (bVar11 & 0x1f))) != 0)))) {
                            uVar7 = pi->x;
                            uVar18 = SUB124(auVar4 / auVar1,0);
                            if (((uVar7 % (uVar12 << (bVar10 & 0x1f)) == 0) ||
                                ((uVar7 == pi->tx0 &&
                                 ((uVar18 << (bVar9 & 0x1f) & ~(-1 << (bVar10 & 0x1f))) != 0)))) &&
                               ((poVar24->pw != 0 &&
                                (((poVar24->ph != 0 &&
                                  (uVar18 != (uint)(((ulong)pi->tx1 + (uVar22 - 1)) / uVar22))) &&
                                 (uVar15 != (uint)(((uVar8 + pi->ty1) - 1) / uVar8))))))) {
                              bVar9 = (byte)poVar24->pdx;
                              bVar10 = (byte)poVar24->pdy;
                              pi->precno = (((uint)(((uVar8 - 1) + (ulong)uVar21) / uVar8) >>
                                            (bVar10 & 0x1f)) - (uVar15 >> (bVar10 & 0x1f))) *
                                           poVar24->pw +
                                           (((uint)(((uVar22 - 1) + (ulong)uVar7) / uVar22) >>
                                            (bVar9 & 0x1f)) - (uVar18 >> (bVar9 & 0x1f)));
                              for (uVar7 = (pi->poc).layno0; pi->layno = uVar7,
                                  uVar7 < (pi->poc).layno1; uVar7 = uVar7 + 1) {
                                uVar21 = pi->step_p * pi->precno +
                                         pi->step_c * pi->compno + pi->step_r * pi->resno +
                                         pi->step_l * uVar7;
                                if (pi->include_size <= uVar21) goto LAB_0012c36c;
                                pOVar14 = pi->include;
                                uVar8 = (ulong)uVar21;
                                if (pOVar14[uVar8] == 0) {
LAB_0012c772:
                                  pOVar14[uVar8] = 1;
                                  return 1;
                                }
LAB_0012c453:
                              }
                              OVar26 = pi->compno;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              OVar26 = OVar26 + 1;
              pi->compno = OVar26;
            }
            uVar7 = (pi->x + pi->dx) - pi->x % pi->dx;
          }
          uVar7 = (pi->y + pi->dy) - pi->y % pi->dy;
        }
        uVar7 = pi->resno + 1;
        pi->resno = uVar7;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_rpcl(): invalid compno0/compno1\n";
    break;
  case OPJ_PCRL:
    uVar23 = (pi->poc).compno0;
    uVar7 = pi->numcomps;
    if ((uVar23 < uVar7) && (uVar13 = (pi->poc).compno1, uVar13 < uVar7 + 1)) {
      if (pi->first == 0) {
        poVar19 = pi->comps;
        uVar22 = (ulong)pi->compno;
        uVar7 = pi->layno;
        poVar20 = poVar19 + uVar22;
        goto LAB_0012cad6;
      }
      pi->first = 0;
      pi->dx = 0;
      pi->dy = 0;
      poVar19 = pi->comps;
      uVar21 = 0;
      OVar26 = 0;
      uVar22 = 0;
      do {
        uVar12 = poVar19[uVar22].numresolutions;
        uVar8 = (ulong)uVar12;
        if (uVar8 != 0) {
          poVar20 = poVar19 + uVar22;
          poVar24 = poVar20->resolutions;
          lVar25 = 0;
          do {
            uVar12 = uVar12 - 1;
            uVar15 = *(int *)((long)&poVar24->pdx + lVar25) + uVar12;
            if (uVar15 < 0x20) {
              bVar9 = (byte)uVar15;
              if (poVar20->dx <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar15 = poVar20->dx << (bVar9 & 0x1f);
                OVar3 = uVar15;
                if (OVar26 < uVar15) {
                  OVar3 = OVar26;
                }
                bVar27 = OVar26 == 0;
                OVar26 = OVar3;
                if (bVar27) {
                  OVar26 = uVar15;
                }
                pi->dx = OVar26;
              }
            }
            uVar15 = *(int *)((long)&poVar24->pdy + lVar25) + uVar12;
            if (uVar15 < 0x20) {
              bVar9 = (byte)uVar15;
              if (poVar20->dy <= 0xffffffffU >> (bVar9 & 0x1f)) {
                uVar18 = poVar20->dy << (bVar9 & 0x1f);
                uVar15 = uVar18;
                if (uVar21 < uVar18) {
                  uVar15 = uVar21;
                }
                bVar27 = uVar21 == 0;
                uVar21 = uVar15;
                if (bVar27) {
                  uVar21 = uVar18;
                }
                pi->dy = uVar21;
              }
            }
            lVar25 = lVar25 + 0x10;
          } while (uVar8 << 4 != lVar25);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar7);
      if (OVar26 == 0) {
        return 0;
      }
      if (uVar21 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar26 = pi->ty0;
        OVar3 = pi->tx1;
        OVar6 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar3;
        (pi->poc).ty0 = OVar26;
        (pi->poc).ty1 = OVar6;
        uVar7 = pi->ty0;
      }
      else {
        uVar7 = (pi->poc).ty0;
      }
      do {
        pi->y = uVar7;
        if ((pi->poc).ty1 <= uVar7) {
          return 0;
        }
        uVar7 = (pi->poc).tx0;
        while (pi->x = uVar7, uVar7 < (pi->poc).tx1) {
          pi->compno = uVar23;
          uVar7 = uVar23;
          while (uVar22 = (ulong)uVar7, uVar7 < uVar13) {
            poVar20 = poVar19 + uVar22;
            OVar26 = (pi->poc).resno0;
            while( true ) {
              pi->resno = OVar26;
              uVar7 = (pi->poc).resno1;
              uVar21 = poVar20->numresolutions;
              if (uVar21 <= uVar7) {
                uVar7 = uVar21;
              }
              if (uVar7 <= OVar26) break;
              uVar21 = uVar21 + ~OVar26;
              if (uVar21 < 0x20) {
                uVar7 = poVar20->dx;
                bVar9 = (byte)uVar21;
                uVar12 = uVar7 << (bVar9 & 0x1f);
                if (uVar12 >> (bVar9 & 0x1f) == uVar7) {
                  uVar15 = poVar20->dy;
                  uVar18 = uVar15 << (bVar9 & 0x1f);
                  if ((uVar18 >> (bVar9 & 0x1f) == uVar15) && (-1 < (int)(uVar18 | uVar12))) {
                    if (uVar7 << (bVar9 & 0x1f) == 0) goto LAB_0012cea2;
                    uVar8 = (ulong)uVar12;
                    if (uVar18 == 0) goto LAB_0012cea2;
                    poVar24 = poVar20->resolutions + OVar26;
                    uVar16 = (ulong)uVar18;
                    uVar12 = poVar24->pdx + uVar21;
                    if ((uVar12 < 0x1f) &&
                       (bVar10 = (byte)uVar12, uVar7 <= 0xffffffffU >> (bVar10 & 0x1f))) {
                      uVar21 = poVar24->pdy + uVar21;
                      if (uVar21 < 0x1f) {
                        bVar11 = (byte)uVar21;
                        uVar21 = uVar15 << (bVar11 & 0x1f);
                        if (uVar21 >> (bVar11 & 0x1f) == uVar15) {
                          uVar12 = pi->y;
                          uVar15 = (uint)(((pi->ty0 + uVar16) - 1) / uVar16);
                          if ((uVar12 % uVar21 == 0) ||
                             ((uVar12 == pi->ty0 &&
                              ((uVar15 << (bVar9 & 0x1f) & ~(-1 << (bVar11 & 0x1f))) != 0)))) {
                            uVar21 = pi->x;
                            uVar18 = (uint)(((uVar8 + pi->tx0) - 1) / uVar8);
                            if (((uVar21 % (uVar7 << (bVar10 & 0x1f)) == 0) ||
                                ((uVar21 == pi->tx0 &&
                                 ((uVar18 << (bVar9 & 0x1f) & ~(-1 << (bVar10 & 0x1f))) != 0)))) &&
                               ((poVar24->pw != 0 &&
                                (((poVar24->ph != 0 &&
                                  (uVar18 != (uint)(((ulong)pi->tx1 + (uVar8 - 1)) / uVar8))) &&
                                 (local_60 = (uint)(((uVar16 + pi->ty1) - 1) / uVar16),
                                 uVar15 != local_60)))))) {
                              bVar9 = (byte)poVar24->pdx;
                              bVar10 = (byte)poVar24->pdy;
                              pi->precno = (((uint)(((uVar16 - 1) + (ulong)uVar12) / uVar16) >>
                                            (bVar10 & 0x1f)) - (uVar15 >> (bVar10 & 0x1f))) *
                                           poVar24->pw +
                                           (((uint)(((uVar8 - 1) + (ulong)uVar21) / uVar8) >>
                                            (bVar9 & 0x1f)) - (uVar18 >> (bVar9 & 0x1f)));
                              for (uVar7 = (pi->poc).layno0; pi->layno = uVar7,
                                  uVar7 < (pi->poc).layno1; uVar7 = uVar7 + 1) {
                                uVar21 = pi->step_p * pi->precno +
                                         pi->step_c * (int)uVar22 + pi->step_r * pi->resno +
                                         pi->step_l * uVar7;
                                if (pi->include_size <= uVar21) goto LAB_0012c36c;
                                pOVar14 = pi->include;
                                uVar8 = (ulong)uVar21;
                                if (pOVar14[uVar8] == 0) goto LAB_0012c772;
LAB_0012cad6:
                              }
                              OVar26 = pi->resno;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              OVar26 = OVar26 + 1;
            }
            uVar7 = (int)uVar22 + 1;
            pi->compno = uVar7;
          }
          uVar7 = (pi->x + pi->dx) - pi->x % pi->dx;
        }
        uVar7 = (pi->y + pi->dy) - pi->y % pi->dy;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_pcrl(): invalid compno0/compno1\n";
    break;
  case OPJ_CPRL:
    uVar23 = (pi->poc).compno0;
    if ((uVar23 < pi->numcomps) && (uVar7 = (pi->poc).compno1, uVar7 < pi->numcomps + 1)) {
      if (pi->first == 0) {
        uVar22 = (ulong)pi->compno;
        uVar23 = pi->layno;
        poVar20 = pi->comps + uVar22;
        goto LAB_0012cf07;
      }
      pi->first = 0;
      do {
        uVar22 = (ulong)uVar23;
        pi->compno = uVar23;
        if (uVar7 <= uVar23) {
          return 0;
        }
        pi->dx = 0;
        pi->dy = 0;
        uVar23 = pi->comps[uVar22].numresolutions;
        uVar8 = (ulong)uVar23;
        if (uVar8 == 0) {
          return 0;
        }
        poVar20 = pi->comps + uVar22;
        poVar24 = poVar20->resolutions;
        lVar25 = 0;
        uVar21 = 0;
        uVar13 = 0;
        do {
          uVar23 = uVar23 - 1;
          uVar12 = *(int *)((long)&poVar24->pdx + lVar25) + uVar23;
          if (uVar12 < 0x20) {
            bVar9 = (byte)uVar12;
            if (poVar20->dx <= 0xffffffffU >> (bVar9 & 0x1f)) {
              uVar15 = poVar20->dx << (bVar9 & 0x1f);
              uVar12 = uVar15;
              if (uVar13 < uVar15) {
                uVar12 = uVar13;
              }
              bVar27 = uVar13 == 0;
              uVar13 = uVar12;
              if (bVar27) {
                uVar13 = uVar15;
              }
              pi->dx = uVar13;
            }
          }
          uVar12 = *(int *)((long)&poVar24->pdy + lVar25) + uVar23;
          if (uVar12 < 0x20) {
            bVar9 = (byte)uVar12;
            if (poVar20->dy <= 0xffffffffU >> (bVar9 & 0x1f)) {
              uVar15 = poVar20->dy << (bVar9 & 0x1f);
              uVar12 = uVar15;
              if (uVar21 < uVar15) {
                uVar12 = uVar21;
              }
              bVar27 = uVar21 == 0;
              uVar21 = uVar12;
              if (bVar27) {
                uVar21 = uVar15;
              }
              pi->dy = uVar21;
            }
          }
          lVar25 = lVar25 + 0x10;
        } while (uVar8 << 4 != lVar25);
        if (uVar13 == 0) {
          return 0;
        }
        if (uVar21 == 0) {
          return 0;
        }
        if (pi->tp_on == '\0') {
          OVar26 = pi->ty0;
          OVar3 = pi->tx1;
          OVar6 = pi->ty1;
          (pi->poc).tx0 = pi->tx0;
          (pi->poc).tx1 = OVar3;
          (pi->poc).ty0 = OVar26;
          (pi->poc).ty1 = OVar6;
          uVar23 = pi->ty0;
        }
        else {
          uVar23 = (pi->poc).ty0;
        }
        while (pi->y = uVar23, uVar23 < (pi->poc).ty1) {
          uVar23 = (pi->poc).tx0;
          while (pi->x = uVar23, uVar23 < (pi->poc).tx1) {
            uVar23 = (pi->poc).resno0;
            while( true ) {
              pi->resno = uVar23;
              uVar13 = (pi->poc).resno1;
              uVar21 = poVar20->numresolutions;
              if (uVar21 <= uVar13) {
                uVar13 = uVar21;
              }
              if (uVar13 <= uVar23) break;
              uVar21 = uVar21 + ~uVar23;
              if (uVar21 < 0x20) {
                uVar13 = poVar20->dx;
                bVar9 = (byte)uVar21;
                uVar12 = uVar13 << (bVar9 & 0x1f);
                if (uVar12 >> (bVar9 & 0x1f) == uVar13) {
                  uVar15 = poVar20->dy;
                  uVar18 = uVar15 << (bVar9 & 0x1f);
                  if ((uVar18 >> (bVar9 & 0x1f) == uVar15) && (-1 < (int)(uVar18 | uVar12))) {
                    if (uVar13 << (bVar9 & 0x1f) == 0) goto LAB_0012cea2;
                    uVar8 = CONCAT44(0,uVar12);
                    auVar2._8_4_ = 0;
                    auVar2._0_8_ = uVar8;
                    auVar5._8_4_ = 0 >> (bVar9 & 0x1f);
                    auVar5._0_8_ = uVar8 + pi->tx0 + -1;
                    if (uVar18 == 0) goto LAB_0012cea2;
                    poVar24 = poVar20->resolutions + uVar23;
                    uVar16 = (ulong)uVar18;
                    uVar12 = poVar24->pdx + uVar21;
                    if ((uVar12 < 0x1f) &&
                       (bVar10 = (byte)uVar12, uVar13 <= 0xffffffffU >> (bVar10 & 0x1f))) {
                      uVar21 = poVar24->pdy + uVar21;
                      if (uVar21 < 0x1f) {
                        bVar11 = (byte)uVar21;
                        uVar21 = uVar15 << (bVar11 & 0x1f);
                        if (uVar21 >> (bVar11 & 0x1f) == uVar15) {
                          uVar12 = pi->y;
                          uVar15 = (uint)(((pi->ty0 + uVar16) - 1) / uVar16);
                          if ((uVar12 % uVar21 == 0) ||
                             ((uVar12 == pi->ty0 &&
                              ((uVar15 << (bVar9 & 0x1f) & ~(-1 << (bVar11 & 0x1f))) != 0)))) {
                            uVar21 = pi->x;
                            uVar18 = SUB124(auVar5 / auVar2,0);
                            if (((uVar21 % (uVar13 << (bVar10 & 0x1f)) == 0) ||
                                ((uVar21 == pi->tx0 &&
                                 ((uVar18 << (bVar9 & 0x1f) & ~(-1 << (bVar10 & 0x1f))) != 0)))) &&
                               ((poVar24->pw != 0 &&
                                (((poVar24->ph != 0 &&
                                  (uVar18 != (uint)(((ulong)pi->tx1 + (uVar8 - 1)) / uVar8))) &&
                                 (local_58 = (uint)(((uVar16 + pi->ty1) - 1) / uVar16),
                                 uVar15 != local_58)))))) {
                              bVar9 = (byte)poVar24->pdx;
                              bVar10 = (byte)poVar24->pdy;
                              pi->precno = (((uint)(((uVar16 - 1) + (ulong)uVar12) / uVar16) >>
                                            (bVar10 & 0x1f)) - (uVar15 >> (bVar10 & 0x1f))) *
                                           poVar24->pw +
                                           (((uint)(((uVar8 - 1) + (ulong)uVar21) / uVar8) >>
                                            (bVar9 & 0x1f)) - (uVar18 >> (bVar9 & 0x1f)));
                              uVar23 = (pi->poc).layno0;
                              pi->layno = uVar23;
                              while (uVar23 < (pi->poc).layno1) {
                                uVar13 = pi->step_p * pi->precno +
                                         pi->step_c * (int)uVar22 + pi->step_r * pi->resno +
                                         pi->step_l * uVar23;
                                if (pi->include_size <= uVar13) goto LAB_0012c36c;
                                pOVar14 = pi->include;
                                uVar8 = (ulong)uVar13;
                                if (pOVar14[uVar8] == 0) goto LAB_0012c772;
LAB_0012cf07:
                                uVar23 = uVar23 + 1;
                                pi->layno = uVar23;
                              }
                              uVar23 = pi->resno;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              uVar23 = uVar23 + 1;
            }
            uVar23 = (pi->x + pi->dx) - pi->x % pi->dx;
          }
          uVar23 = (pi->y + pi->dy) - pi->y % pi->dy;
        }
        uVar23 = (int)uVar22 + 1;
      } while( true );
    }
    p_event_mgr = pi->manager;
    fmt = "opj_pi_next_cprl(): invalid compno0/compno1\n";
    break;
  default:
    return 0;
  }
LAB_0012c286:
  opj_event_msg(p_event_mgr,1,fmt);
  return 0;
LAB_0012c36c:
  p_event_mgr = pi->manager;
  fmt = "Invalid access to pi->include";
  goto LAB_0012c286;
}

Assistant:

OPJ_BOOL opj_pi_next(opj_pi_iterator_t * pi)
{
    switch (pi->poc.prg) {
    case OPJ_LRCP:
        return opj_pi_next_lrcp(pi);
    case OPJ_RLCP:
        return opj_pi_next_rlcp(pi);
    case OPJ_RPCL:
        return opj_pi_next_rpcl(pi);
    case OPJ_PCRL:
        return opj_pi_next_pcrl(pi);
    case OPJ_CPRL:
        return opj_pi_next_cprl(pi);
    case OPJ_PROG_UNKNOWN:
        return OPJ_FALSE;
    }

    return OPJ_FALSE;
}